

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O3

void Kit_TruthSwapAdjacentVars(uint *pOut,uint *pIn,int nVars,int iVar)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  uint *puVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint *puVar12;
  int iVar13;
  ulong uVar14;
  uint *puVar15;
  uint *puVar16;
  uint *puVar17;
  uint *puVar18;
  
  uVar10 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
  if (nVars < 6) {
    uVar10 = 1;
  }
  if (nVars + -1 <= iVar) {
    __assert_fail("iVar < nVars - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitTruth.c"
                  ,0x39,"void Kit_TruthSwapAdjacentVars(unsigned int *, unsigned int *, int, int)");
  }
  iVar9 = (int)uVar10;
  if (iVar < 4) {
    if (0 < iVar9) {
      uVar11 = Kit_TruthSwapAdjacentVars::PMasks[iVar][0];
      uVar1 = Kit_TruthSwapAdjacentVars::PMasks[iVar][1];
      uVar2 = Kit_TruthSwapAdjacentVars::PMasks[iVar][2];
      uVar14 = 0;
      do {
        uVar3 = pIn[uVar14];
        bVar5 = (byte)(1 << ((byte)iVar & 0x1f));
        pOut[uVar14] = (uVar3 & uVar2) >> (bVar5 & 0x1f) |
                       (uVar1 & uVar3) << (bVar5 & 0x1f) | uVar11 & uVar3;
        uVar14 = uVar14 + 1;
      } while (uVar10 != uVar14);
    }
  }
  else if (iVar == 4) {
    if (0 < iVar9) {
      uVar14 = 0;
      do {
        pOut[uVar14] = pIn[uVar14 + 1] << 0x10 | (uint)(ushort)pIn[uVar14];
        pOut[uVar14 + 1] =
             CONCAT22(*(undefined2 *)((long)pIn + uVar14 * 4 + 6),
                      *(undefined2 *)((long)pIn + uVar14 * 4 + 2));
        uVar14 = uVar14 + 2;
      } while (uVar14 < uVar10);
    }
  }
  else if (0 < iVar9) {
    iVar4 = iVar + -5;
    bVar5 = (byte)iVar4;
    uVar11 = 1 << (bVar5 & 0x1f);
    iVar13 = 2 << (bVar5 & 0x1f);
    iVar7 = 3 << (bVar5 & 0x1f);
    iVar6 = 4 << (bVar5 & 0x1f);
    uVar10 = 1;
    if (1 < (int)uVar11) {
      uVar10 = (ulong)uVar11;
    }
    puVar12 = pOut + (int)uVar11;
    puVar15 = pIn + iVar13;
    puVar8 = pOut + iVar13;
    puVar17 = pIn + (int)uVar11;
    puVar18 = pIn + iVar7;
    puVar16 = pOut + iVar7;
    iVar7 = 0;
    do {
      if (iVar4 != 0x1f) {
        uVar14 = 0;
        do {
          pOut[uVar14] = pIn[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar10 != uVar14);
        if (iVar4 != 0x1f) {
          uVar14 = 0;
          do {
            puVar12[uVar14] = puVar15[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar10 != uVar14);
          if (iVar4 != 0x1f) {
            uVar14 = 0;
            do {
              puVar8[uVar14] = puVar17[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar10 != uVar14);
            if (iVar4 != 0x1f) {
              uVar14 = 0;
              do {
                puVar16[uVar14] = puVar18[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar10 != uVar14);
            }
          }
        }
      }
      iVar7 = iVar7 + iVar6;
      pOut = pOut + iVar6;
      pIn = pIn + iVar6;
      puVar12 = puVar12 + iVar6;
      puVar15 = puVar15 + iVar6;
      puVar8 = puVar8 + iVar6;
      puVar17 = puVar17 + iVar6;
      puVar18 = puVar18 + iVar6;
      puVar16 = puVar16 + iVar6;
    } while (iVar7 < iVar9);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Swaps two adjacent variables in the truth table.]

  Description [Swaps var number Start and var number Start+1 (0-based numbers).
  The input truth table is pIn. The output truth table is pOut.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Kit_TruthSwapAdjacentVars( unsigned * pOut, unsigned * pIn, int nVars, int iVar )
{
    static unsigned PMasks[4][3] = {
        { 0x99999999, 0x22222222, 0x44444444 },
        { 0xC3C3C3C3, 0x0C0C0C0C, 0x30303030 },
        { 0xF00FF00F, 0x00F000F0, 0x0F000F00 },
        { 0xFF0000FF, 0x0000FF00, 0x00FF0000 }
    };
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step, Shift;

    assert( iVar < nVars - 1 );
    if ( iVar < 4 )
    {
        Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & PMasks[iVar][0]) | ((pIn[i] & PMasks[iVar][1]) << Shift) | ((pIn[i] & PMasks[iVar][2]) >> Shift);
    }
    else if ( iVar > 4 )
    {
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 4*Step )
        {
            for ( i = 0; i < Step; i++ )
                pOut[i] = pIn[i];
            for ( i = 0; i < Step; i++ )
                pOut[Step+i] = pIn[2*Step+i];
            for ( i = 0; i < Step; i++ )
                pOut[2*Step+i] = pIn[Step+i];
            for ( i = 0; i < Step; i++ )
                pOut[3*Step+i] = pIn[3*Step+i];
            pIn  += 4*Step;
            pOut += 4*Step;
        }
    }
    else // if ( iVar == 4 )
    {
        for ( i = 0; i < nWords; i += 2 )
        {
            pOut[i]   = (pIn[i]   & 0x0000FFFF) | ((pIn[i+1] & 0x0000FFFF) << 16);
            pOut[i+1] = (pIn[i+1] & 0xFFFF0000) | ((pIn[i]   & 0xFFFF0000) >> 16);
        }
    }
}